

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

Iterator * __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Iterator::
operator=(Iterator *this,Iterator *other)

{
  Iterator *other_local;
  Iterator *this_local;
  
  if (this != other) {
    this->cur_idx_ = other->cur_idx_;
    this->cur_leaf_ = other->cur_leaf_;
    this->cur_bitmap_idx_ = other->cur_bitmap_idx_;
    this->cur_bitmap_data_ = other->cur_bitmap_data_;
  }
  return this;
}

Assistant:

Iterator& operator=(const Iterator& other) {
      if (this != &other) {
        cur_idx_ = other.cur_idx_;
        cur_leaf_ = other.cur_leaf_;
        cur_bitmap_idx_ = other.cur_bitmap_idx_;
        cur_bitmap_data_ = other.cur_bitmap_data_;
      }
      return *this;
    }